

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

DataParameter * __thiscall caffe::DataParameter::New(DataParameter *this,Arena *arena)

{
  DataParameter *this_00;
  DataParameter *n;
  Arena *arena_local;
  DataParameter *this_local;
  
  this_00 = (DataParameter *)operator_new(0x48);
  DataParameter(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<caffe::DataParameter>(arena,this_00);
  }
  return this_00;
}

Assistant:

DataParameter* DataParameter::New(::google::protobuf::Arena* arena) const {
  DataParameter* n = new DataParameter;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}